

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O1

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenerateTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Options *opts,Descriptor *message,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *alt_annotation,
          Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls)

{
  FieldDescriptor *buffer;
  char *pcVar1;
  byte bVar2;
  Nonnull<char_*> pcVar3;
  _Array_type *p_Var4;
  Descriptor *pDVar5;
  AlphaNum *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  char *pcVar6;
  iterator iVar7;
  string_view format;
  string_view format_00;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *subs;
  string call_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *local_280;
  string local_278;
  Descriptor *local_258;
  key_arg<std::basic_string_view<char>_> *local_250;
  string local_248;
  string local_228;
  undefined1 local_208 [32];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_1e8;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_198;
  undefined1 local_148 [48];
  AlphaNum local_118;
  Sub local_e8;
  
  if ((this[0x90] == (anon_unknown_0)0x1) &&
     (*(int *)(*(long *)((opts->dllexport_decl)._M_string_length + 0x80) + 0xa8) != 3)) {
    bVar2 = *(byte *)(*(long *)((long)&(opts->dllexport_decl).field_2 + 8) + 0x53) ^ 1;
  }
  else {
    bVar2 = 0;
  }
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (in_R9 != (AlphaNum *)0x0) {
    local_280 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                 *)(this + 0x98);
    local_250 = (key_arg<std::basic_string_view<char>_> *)
                ((long)in_R9 * 0x60 + (long)alt_annotation);
    pDVar5 = message;
    local_258 = message;
    do {
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_local_buf[0] = '\0';
      if ((bVar2 == 0) ||
         (*(char *)&((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x50))->
                    _M_str != '\0')) {
LAB_00290025:
        if ((this[0xcb] == (anon_unknown_0)0x1) && (*(char *)&pDVar5->containing_type_ == '\x01')) {
          std::__cxx11::string::_M_assign((string *)&local_2a0);
        }
      }
      else {
        iVar7 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                ::find<std::basic_string_view<char,std::char_traits<char>>>
                          (local_280,(key_arg<std::basic_string_view<char>_> *)alt_annotation);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_280);
        if (iVar7.ctrl_ != (ctrl_t *)0x0) goto LAB_00290025;
        local_208._16_8_ =
             ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x10))->_M_len;
        local_208._24_8_ =
             ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x10))->_M_str;
        local_208._0_8_ = (pointer)0x10;
        local_208._8_8_ = "Impl_::_tracker_";
        format._M_str = (char *)local_208;
        format._M_len = (size_t)"$0.$1";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_2a0,(Nonnull<std::string_*>)&DAT_00000005,format,
                   (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
        if (*(char *)((long)&((key_arg<std::basic_string_view<char>_> *)
                             ((long)alt_annotation + 0x20))->_M_len + 4) == '\x01') {
          buffer = (FieldDescriptor *)(local_208 + 0x10);
          pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                             ((int32_t)((key_arg<std::basic_string_view<char>_> *)
                                       ((long)alt_annotation + 0x20))->_M_len,
                              (Nonnull<char_*>)buffer);
          local_208._0_8_ = pcVar3 + -(long)buffer;
          format_00._M_str = (char *)&local_e8;
          format_00._M_len = (size_t)"<$0>";
          local_208._8_8_ = buffer;
          local_e8.key_._M_dataplus._M_p = (pointer)local_208._0_8_;
          local_e8.key_._M_string_length = (size_type)buffer;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_2a0,(Nonnull<std::string_*>)0x4,format_00,
                     (Nullable<const_absl::string_view_*>)0x1,(size_t)in_R9);
        }
        local_208._0_8_ = (pointer)0x1;
        local_208._8_8_ = "(";
        absl::lts_20250127::StrAppend(&local_2a0,(AlphaNum *)local_208);
        if (*(char *)&((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x30))->
                      _M_str == '\x01') {
          local_208._0_8_ =
               ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x20))->_M_str;
          local_208._8_8_ =
               ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x30))->_M_len;
          absl::lts_20250127::StrAppend(&local_2a0,(AlphaNum *)local_208);
          local_208._0_8_ = (pointer)0x2;
          message = (Descriptor *)0x5e529c;
        }
        else {
          local_208._0_8_ = (pointer)0x0;
          message = (Descriptor *)0x50989c;
        }
        pcVar1 = ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x40))->_M_str;
        for (pcVar6 = (char *)((key_arg<std::basic_string_view<char>_> *)
                              ((long)alt_annotation + 0x40))->_M_len; pcVar6 != pcVar1;
            pcVar6 = pcVar6 + 0x20) {
          local_e8.key_._M_string_length = *(size_type *)pcVar6;
          local_e8.key_._M_dataplus._M_p = *(pointer *)(pcVar6 + 8);
          local_208._8_8_ = message;
          absl::lts_20250127::StrAppend(&local_2a0,(AlphaNum *)local_208,(AlphaNum *)&local_e8);
          local_208._0_8_ = (pointer)0x2;
          message = (Descriptor *)0x5e529c;
        }
        local_208._0_8_ = (pointer)0x2;
        local_208._8_8_ = ");";
        absl::lts_20250127::StrAppend(&local_2a0,(AlphaNum *)local_208);
        pDVar5 = local_258;
      }
      if ((FeatureSet *)local_2a0._M_string_length != (FeatureSet *)0x0) {
        std::__cxx11::string::push_back((char)&local_2a0);
        if (bVar2 != 0) {
          local_208._0_8_ = &DAT_00000006;
          local_208._8_8_ = "if (::";
          local_e8.key_._M_dataplus._M_p = &DAT_00000006;
          if (this[0xca] != (anon_unknown_0)0x0) {
            local_e8.key_._M_dataplus._M_p = (Nonnull<char_*>)0x10;
          }
          local_e8.key_._M_string_length = 0x52e6df;
          if (this[0xca] != (anon_unknown_0)0x0) {
            local_e8.key_._M_string_length = 0x52e6e6;
          }
          local_148[0] = '&';
          local_148._1_3_ = 0;
          local_148._4_2_ = 0;
          local_148._6_2_ = 0;
          local_148._8_8_ = "::internal::cpp::IsTrackingEnabled()) ";
          local_118.piece_._M_len = local_2a0._M_string_length;
          local_118.piece_._M_str = local_2a0._M_dataplus._M_p;
          message = (Descriptor *)local_148;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_228,(lts_20250127 *)local_208,(AlphaNum *)&local_e8,(AlphaNum *)message,
                     &local_118,in_R9);
          std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
        }
      }
      local_148[0] = '\t';
      local_148._1_3_ = 0;
      local_148._4_2_ = 0;
      local_148._6_2_ = 0;
      local_148._8_8_ = "annotate_";
      local_118.piece_._M_len = ((key_arg<std::basic_string_view<char>_> *)alt_annotation)->_M_len;
      local_118.piece_._M_str = ((key_arg<std::basic_string_view<char>_> *)alt_annotation)->_M_str;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_248,(lts_20250127 *)local_148,&local_118,(AlphaNum *)message);
      io::Printer::Sub::Sub<std::__cxx11::string&>(&local_e8,&local_248,&local_2a0);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,";","");
      io::Printer::Sub::WithSuffix((Sub *)local_208,&local_e8,&local_278);
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::emplace_back<google::protobuf::io::Printer::Sub>(__return_storage_ptr__,(Sub *)local_208);
      if (local_198._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_198);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_p != &local_1b0) {
        operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_1e8.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)((anon_class_1_0_00000001 *)&local_228,&local_1e8);
      local_1e8.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_e8.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
          == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   &local_e8.annotation_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.value_.consume_after._M_dataplus._M_p !=
          &local_e8.value_.consume_after.field_2) {
        operator_delete(local_e8.value_.consume_after._M_dataplus._M_p,
                        local_e8.value_.consume_after.field_2._M_allocated_capacity + 1);
      }
      p_Var4 = &std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                ::_S_vtable;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_e8.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)((anon_class_1_0_00000001 *)&local_228,&local_e8.value_.value);
      local_e8.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      message = (Descriptor *)p_Var4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.key_._M_dataplus._M_p != &local_e8.key_.field_2) {
        operator_delete(local_e8.key_._M_dataplus._M_p,
                        local_e8.key_.field_2._M_allocated_capacity + 1);
        message = (Descriptor *)p_Var4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                 local_2a0.field_2._M_local_buf[0]) + 1);
      }
      alt_annotation =
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)alt_annotation + 0x60);
    } while ((key_arg<std::basic_string_view<char>_> *)alt_annotation != local_250);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> GenerateTrackerCalls(
    const Options& opts, const Descriptor* message,
    absl::optional<std::string> alt_annotation, absl::Span<const Call> calls) {
  bool enable_tracking = HasTracker(message, opts);
  const auto& forbidden =
      opts.field_listener_options.forbidden_field_listener_events;

  std::vector<Sub> subs;
  for (const auto& call : calls) {
    std::string call_str;
    if (enable_tracking && !call.suppressed && !forbidden.contains(call.var)) {
      absl::SubstituteAndAppend(&call_str, "$0.$1", kTracker, call.call);
      if (call.field_index.has_value()) {
        absl::SubstituteAndAppend(&call_str, "<$0>", *call.field_index);
      }
      absl::StrAppend(&call_str, "(");

      absl::string_view arg_sep = "";
      if (call.thiz.has_value()) {
        absl::StrAppend(&call_str, *call.thiz);
        arg_sep = ", ";
      }

      for (const auto& arg : call.args) {
        absl::StrAppend(&call_str, arg_sep, arg);
        arg_sep = ", ";
      }

      absl::StrAppend(&call_str, ");");
    } else if (opts.annotate_accessor && alt_annotation.has_value()) {
      call_str = *alt_annotation;
    }

    if (!call_str.empty()) {
      // TODO: Until we migrate all of the C++ backend to use
      // Emit(), we need to include a newline here so that the line that follows
      // the annotation is on its own line.
      call_str.push_back('\n');
      if (enable_tracking) {
        call_str =
            absl::StrCat("if (::", ProtobufNamespace(opts),
                         "::internal::cpp::IsTrackingEnabled()) ", call_str);
      }
    }

    subs.push_back(
        Sub(absl::StrCat(kVarPrefix, call.var), call_str).WithSuffix(";"));
  }

  return subs;
}